

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchFunc.cpp
# Opt level: O3

void Bmatch_PIInformation(Abc_Frame_t *pAbc)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  char *pcVar7;
  int *piVar8;
  long lVar9;
  uint uVar10;
  int j;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int i;
  long lVar16;
  ulong uVar17;
  int i_1;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar36;
  undefined1 auVar32 [16];
  int iVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar78;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar79;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar80;
  int iVar88;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  
  pvVar1 = pAbc->pInformation;
  lVar9 = *(long *)((long)pvVar1 + 0x50);
  lVar12 = *(long *)((long)pvVar1 + 0x58);
  lVar3 = lVar12 - lVar9 >> 3;
  pvVar4 = operator_new__(lVar3 + 1);
  lVar6 = *(long *)((long)pvVar1 + 0x68);
  lVar16 = *(long *)((long)pvVar1 + 0x70) - lVar6 >> 3;
  pvVar5 = operator_new__(lVar16 + 1);
  *(undefined1 *)((long)pvVar4 + lVar3) = 0;
  *(undefined1 *)((long)pvVar5 + lVar16) = 0;
  uVar17 = 0;
LAB_007bcc9d:
  if (uVar17 < (ulong)(lVar12 - lVar9 >> 3)) {
    Abc_ObjName(*(Abc_Obj_t **)(*(long *)(lVar9 + uVar17 * 8) + 8));
    printf("%6s:                              ");
  }
  else {
    if ((ulong)(*(long *)((long)pvVar1 + 0x70) - lVar6 >> 3) <= uVar17) {
      operator_delete__(pvVar4);
      operator_delete__(pvVar5);
      puts("PI supp information for two circuits : ");
      puts("  cir1   supp     cir2   supp   ");
      uVar17 = 0;
      uVar10 = 0;
      uVar11 = 0;
      do {
        if (uVar17 < (ulong)(*(long *)((long)pvVar1 + 0x88) - *(long *)((long)pvVar1 + 0x80) >> 3))
        {
          piVar8 = *(int **)(*(long *)((long)pvVar1 + 0x80) + uVar17 * 8);
          uVar11 = uVar11 + *piVar8;
          pcVar7 = Abc_ObjName(*(Abc_Obj_t **)(piVar8 + 2));
          printf("%6s%7d   ",pcVar7,(ulong)**(uint **)(*(long *)((long)pvVar1 + 0x80) + uVar17 * 8))
          ;
        }
        else {
          if ((ulong)(*(long *)((long)pvVar1 + 0xa0) - *(long *)((long)pvVar1 + 0x98) >> 3) <=
              uVar17) {
            printf(" total %6d    total %6d   \n",(ulong)uVar11,(ulong)uVar10);
            return;
          }
          printf("                ");
        }
        if (uVar17 < (ulong)(*(long *)((long)pvVar1 + 0xa0) - *(long *)((long)pvVar1 + 0x98) >> 3))
        {
          piVar8 = *(int **)(*(long *)((long)pvVar1 + 0x98) + uVar17 * 8);
          uVar10 = uVar10 + *piVar8;
          pcVar7 = Abc_ObjName(*(Abc_Obj_t **)(piVar8 + 2));
          printf("%6s%7d",pcVar7,(ulong)**(uint **)(*(long *)((long)pvVar1 + 0x98) + uVar17 * 8));
        }
        else {
          printf("             ");
        }
        putchar(10);
        uVar17 = uVar17 + 1;
      } while( true );
    }
    printf("                                     ");
  }
  if (uVar17 < (ulong)(*(long *)((long)pvVar1 + 0x70) - *(long *)((long)pvVar1 + 0x68) >> 3)) {
    Abc_ObjName(*(Abc_Obj_t **)(*(long *)(*(long *)((long)pvVar1 + 0x68) + uVar17 * 8) + 8));
    printf("%6s:");
  }
  else {
    printf("       ");
  }
  putchar(10);
  lVar12 = 0;
  do {
    lVar9 = *(long *)((long)pvVar1 + 0x50);
    piVar8 = *(int **)(lVar9 + uVar17 * 8);
    if (lVar12 < *piVar8) {
      lVar6 = *(long *)((long)pvVar1 + 0x58);
      lVar3 = lVar6 - lVar9;
      if (lVar3 != 0) {
        uVar13 = 0;
        do {
          lVar16 = *(long *)(*(long *)(piVar8 + 4) + lVar12 * 8);
          lVar15 = *(long *)(lVar16 + 0x10);
          if (*(long *)(lVar16 + 0x18) != lVar15) {
            uVar14 = 0;
            do {
              if (*(long *)(lVar15 + uVar14 * 8) == *(long *)(lVar9 + uVar13 * 8)) {
                *(undefined1 *)((long)pvVar4 + uVar13) = 0x31;
                piVar8 = *(int **)(lVar9 + uVar17 * 8);
              }
              uVar14 = uVar14 + 1;
              lVar16 = *(long *)(*(long *)(piVar8 + 4) + lVar12 * 8);
              lVar15 = *(long *)(lVar16 + 0x10);
            } while (uVar14 < (ulong)(*(long *)(lVar16 + 0x18) - lVar15 >> 3));
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)(lVar3 >> 3));
        lVar6 = lVar6 - lVar9;
        if (lVar6 != 0) {
          uVar13 = 0;
          do {
            if (*(char *)((long)pvVar4 + uVar13) != '1') {
              *(undefined1 *)((long)pvVar4 + uVar13) = 0x30;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < (ulong)(lVar6 >> 3));
        }
      }
      printf("        %28s");
      auVar2 = _DAT_008403e0;
      lVar9 = *(long *)((long)pvVar1 + 0x58) - *(long *)((long)pvVar1 + 0x50);
      if (lVar9 != 0) {
        lVar9 = lVar9 >> 3;
        lVar9 = lVar9 + (ulong)(lVar9 == 0);
        lVar6 = lVar9 + -1;
        auVar18._8_4_ = (int)lVar6;
        auVar18._0_8_ = lVar6;
        auVar18._12_4_ = (int)((ulong)lVar6 >> 0x20);
        uVar13 = 0;
        auVar34 = _DAT_008403d0;
        auVar49 = _DAT_008403c0;
        auVar94 = _DAT_008466c0;
        auVar71 = _DAT_008466b0;
        auVar24 = _DAT_008466a0;
        auVar26 = _DAT_00846690;
        auVar28 = _DAT_00846680;
        auVar30 = _DAT_00846670;
        do {
          auVar32 = auVar18 ^ auVar2;
          auVar38 = auVar34 ^ auVar2;
          iVar78 = auVar32._0_4_;
          iVar80 = -(uint)(iVar78 < auVar38._0_4_);
          iVar79 = auVar32._4_4_;
          auVar39._4_4_ = -(uint)(iVar79 < auVar38._4_4_);
          iVar36 = auVar32._8_4_;
          iVar88 = -(uint)(iVar36 < auVar38._8_4_);
          iVar37 = auVar32._12_4_;
          auVar39._12_4_ = -(uint)(iVar37 < auVar38._12_4_);
          auVar62._4_4_ = iVar80;
          auVar62._0_4_ = iVar80;
          auVar62._8_4_ = iVar88;
          auVar62._12_4_ = iVar88;
          auVar89 = pshuflw(in_XMM13,auVar62,0xe8);
          auVar32._4_4_ = -(uint)(auVar38._4_4_ == iVar79);
          auVar32._12_4_ = -(uint)(auVar38._12_4_ == iVar37);
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar90 = pshuflw(in_XMM14,auVar32,0xe8);
          auVar39._0_4_ = auVar39._4_4_;
          auVar39._8_4_ = auVar39._12_4_;
          auVar38 = pshuflw(auVar89,auVar39,0xe8);
          auVar91._8_4_ = 0xffffffff;
          auVar91._0_8_ = 0xffffffffffffffff;
          auVar91._12_4_ = 0xffffffff;
          auVar38 = (auVar38 | auVar90 & auVar89) ^ auVar91;
          auVar38 = packssdw(auVar38,auVar38);
          if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar4 + uVar13) = 0x30;
          }
          auVar39 = auVar32 & auVar62 | auVar39;
          auVar32 = packssdw(auVar39,auVar39);
          auVar32 = packssdw(auVar32 ^ auVar91,auVar32 ^ auVar91);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32._0_4_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 1) = 0x30;
          }
          auVar32 = auVar49 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar32._0_4_);
          auVar90._4_4_ = -(uint)(iVar79 < auVar32._4_4_);
          iVar88 = -(uint)(iVar36 < auVar32._8_4_);
          auVar90._12_4_ = -(uint)(iVar37 < auVar32._12_4_);
          auVar38._4_4_ = iVar80;
          auVar38._0_4_ = iVar80;
          auVar38._8_4_ = iVar88;
          auVar38._12_4_ = iVar88;
          auVar89._4_4_ = -(uint)(auVar32._4_4_ == iVar79);
          auVar89._12_4_ = -(uint)(auVar32._12_4_ == iVar37);
          auVar89._0_4_ = auVar89._4_4_;
          auVar89._8_4_ = auVar89._12_4_;
          auVar90._0_4_ = auVar90._4_4_;
          auVar90._8_4_ = auVar90._12_4_;
          auVar32 = auVar89 & auVar38 | auVar90;
          auVar32 = packssdw(auVar32,auVar32);
          auVar32 = packssdw(auVar32 ^ auVar91,auVar32 ^ auVar91);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 2) = 0x30;
          }
          auVar38 = pshufhw(auVar38,auVar38,0x84);
          auVar62 = pshufhw(auVar89,auVar89,0x84);
          auVar39 = pshufhw(auVar38,auVar90,0x84);
          auVar38 = (auVar39 | auVar62 & auVar38) ^ auVar91;
          auVar38 = packssdw(auVar38,auVar38);
          auVar38 = packsswb(auVar38,auVar38);
          if ((auVar38._0_4_ >> 0x18 & 1) != 0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 3) = 0x30;
          }
          auVar38 = auVar94 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar38._0_4_);
          auVar41._4_4_ = -(uint)(iVar79 < auVar38._4_4_);
          iVar88 = -(uint)(iVar36 < auVar38._8_4_);
          auVar41._12_4_ = -(uint)(iVar37 < auVar38._12_4_);
          auVar63._4_4_ = iVar80;
          auVar63._0_4_ = iVar80;
          auVar63._8_4_ = iVar88;
          auVar63._12_4_ = iVar88;
          auVar32 = pshuflw(auVar32,auVar63,0xe8);
          auVar40._4_4_ = -(uint)(auVar38._4_4_ == iVar79);
          auVar40._12_4_ = -(uint)(auVar38._12_4_ == iVar37);
          auVar40._0_4_ = auVar40._4_4_;
          auVar40._8_4_ = auVar40._12_4_;
          auVar39 = pshuflw(auVar91,auVar40,0xe8);
          auVar41._0_4_ = auVar41._4_4_;
          auVar41._8_4_ = auVar41._12_4_;
          auVar38 = pshuflw(auVar32,auVar41,0xe8);
          auVar92._8_4_ = 0xffffffff;
          auVar92._0_8_ = 0xffffffffffffffff;
          auVar92._12_4_ = 0xffffffff;
          auVar32 = (auVar38 | auVar39 & auVar32) ^ auVar92;
          auVar32 = packssdw(auVar32,auVar32);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 4) = 0x30;
          }
          auVar41 = auVar40 & auVar63 | auVar41;
          auVar32 = packssdw(auVar41,auVar41);
          auVar32 = packssdw(auVar32 ^ auVar92,auVar32 ^ auVar92);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32._4_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 5) = 0x30;
          }
          auVar32 = auVar71 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar32._0_4_);
          auVar81._4_4_ = -(uint)(iVar79 < auVar32._4_4_);
          iVar88 = -(uint)(iVar36 < auVar32._8_4_);
          auVar81._12_4_ = -(uint)(iVar37 < auVar32._12_4_);
          auVar42._4_4_ = iVar80;
          auVar42._0_4_ = iVar80;
          auVar42._8_4_ = iVar88;
          auVar42._12_4_ = iVar88;
          auVar64._4_4_ = -(uint)(auVar32._4_4_ == iVar79);
          auVar64._12_4_ = -(uint)(auVar32._12_4_ == iVar37);
          auVar64._0_4_ = auVar64._4_4_;
          auVar64._8_4_ = auVar64._12_4_;
          auVar81._0_4_ = auVar81._4_4_;
          auVar81._8_4_ = auVar81._12_4_;
          auVar32 = auVar64 & auVar42 | auVar81;
          auVar32 = packssdw(auVar32,auVar32);
          auVar32 = packssdw(auVar32 ^ auVar92,auVar32 ^ auVar92);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 6) = 0x30;
          }
          auVar38 = pshufhw(auVar42,auVar42,0x84);
          auVar62 = pshufhw(auVar64,auVar64,0x84);
          auVar39 = pshufhw(auVar38,auVar81,0x84);
          auVar38 = (auVar39 | auVar62 & auVar38) ^ auVar92;
          auVar38 = packssdw(auVar38,auVar38);
          auVar38 = packsswb(auVar38,auVar38);
          if ((auVar38._6_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 7) = 0x30;
          }
          auVar38 = auVar24 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar38._0_4_);
          auVar44._4_4_ = -(uint)(iVar79 < auVar38._4_4_);
          iVar88 = -(uint)(iVar36 < auVar38._8_4_);
          auVar44._12_4_ = -(uint)(iVar37 < auVar38._12_4_);
          auVar65._4_4_ = iVar80;
          auVar65._0_4_ = iVar80;
          auVar65._8_4_ = iVar88;
          auVar65._12_4_ = iVar88;
          auVar32 = pshuflw(auVar32,auVar65,0xe8);
          auVar43._4_4_ = -(uint)(auVar38._4_4_ == iVar79);
          auVar43._12_4_ = -(uint)(auVar38._12_4_ == iVar37);
          auVar43._0_4_ = auVar43._4_4_;
          auVar43._8_4_ = auVar43._12_4_;
          auVar39 = pshuflw(auVar92,auVar43,0xe8);
          auVar44._0_4_ = auVar44._4_4_;
          auVar44._8_4_ = auVar44._12_4_;
          auVar38 = pshuflw(auVar32,auVar44,0xe8);
          auVar93._8_4_ = 0xffffffff;
          auVar93._0_8_ = 0xffffffffffffffff;
          auVar93._12_4_ = 0xffffffff;
          auVar32 = (auVar38 | auVar39 & auVar32) ^ auVar93;
          auVar32 = packssdw(auVar32,auVar32);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 8) = 0x30;
          }
          auVar44 = auVar43 & auVar65 | auVar44;
          auVar32 = packssdw(auVar44,auVar44);
          auVar32 = packssdw(auVar32 ^ auVar93,auVar32 ^ auVar93);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32._8_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 9) = 0x30;
          }
          auVar32 = auVar26 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar32._0_4_);
          auVar82._4_4_ = -(uint)(iVar79 < auVar32._4_4_);
          iVar88 = -(uint)(iVar36 < auVar32._8_4_);
          auVar82._12_4_ = -(uint)(iVar37 < auVar32._12_4_);
          auVar45._4_4_ = iVar80;
          auVar45._0_4_ = iVar80;
          auVar45._8_4_ = iVar88;
          auVar45._12_4_ = iVar88;
          auVar66._4_4_ = -(uint)(auVar32._4_4_ == iVar79);
          auVar66._12_4_ = -(uint)(auVar32._12_4_ == iVar37);
          auVar66._0_4_ = auVar66._4_4_;
          auVar66._8_4_ = auVar66._12_4_;
          auVar82._0_4_ = auVar82._4_4_;
          auVar82._8_4_ = auVar82._12_4_;
          auVar32 = auVar66 & auVar45 | auVar82;
          auVar32 = packssdw(auVar32,auVar32);
          auVar32 = packssdw(auVar32 ^ auVar93,auVar32 ^ auVar93);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 10) = 0x30;
          }
          auVar38 = pshufhw(auVar45,auVar45,0x84);
          auVar62 = pshufhw(auVar66,auVar66,0x84);
          auVar39 = pshufhw(auVar38,auVar82,0x84);
          auVar38 = (auVar39 | auVar62 & auVar38) ^ auVar93;
          auVar38 = packssdw(auVar38,auVar38);
          auVar38 = packsswb(auVar38,auVar38);
          if ((auVar38._10_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 0xb) = 0x30;
          }
          auVar38 = auVar28 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar38._0_4_);
          auVar47._4_4_ = -(uint)(iVar79 < auVar38._4_4_);
          iVar88 = -(uint)(iVar36 < auVar38._8_4_);
          auVar47._12_4_ = -(uint)(iVar37 < auVar38._12_4_);
          auVar67._4_4_ = iVar80;
          auVar67._0_4_ = iVar80;
          auVar67._8_4_ = iVar88;
          auVar67._12_4_ = iVar88;
          auVar32 = pshuflw(auVar32,auVar67,0xe8);
          auVar46._4_4_ = -(uint)(auVar38._4_4_ == iVar79);
          auVar46._12_4_ = -(uint)(auVar38._12_4_ == iVar37);
          auVar46._0_4_ = auVar46._4_4_;
          auVar46._8_4_ = auVar46._12_4_;
          auVar39 = pshuflw(auVar93,auVar46,0xe8);
          auVar47._0_4_ = auVar47._4_4_;
          auVar47._8_4_ = auVar47._12_4_;
          auVar38 = pshuflw(auVar32,auVar47,0xe8);
          in_XMM14._8_4_ = 0xffffffff;
          in_XMM14._0_8_ = 0xffffffffffffffff;
          in_XMM14._12_4_ = 0xffffffff;
          auVar32 = (auVar38 | auVar39 & auVar32) ^ in_XMM14;
          auVar32 = packssdw(auVar32,auVar32);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 0xc) = 0x30;
          }
          auVar47 = auVar46 & auVar67 | auVar47;
          auVar32 = packssdw(auVar47,auVar47);
          auVar32 = packssdw(auVar32 ^ in_XMM14,auVar32 ^ in_XMM14);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32._12_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 0xd) = 0x30;
          }
          auVar32 = auVar30 ^ auVar2;
          auVar83._0_4_ = -(uint)(iVar78 < auVar32._0_4_);
          auVar83._4_4_ = -(uint)(iVar79 < auVar32._4_4_);
          auVar83._8_4_ = -(uint)(iVar36 < auVar32._8_4_);
          auVar83._12_4_ = -(uint)(iVar37 < auVar32._12_4_);
          auVar48._4_4_ = auVar83._0_4_;
          auVar48._0_4_ = auVar83._0_4_;
          auVar48._8_4_ = auVar83._8_4_;
          auVar48._12_4_ = auVar83._8_4_;
          iVar78 = -(uint)(auVar32._4_4_ == iVar79);
          iVar79 = -(uint)(auVar32._12_4_ == iVar37);
          auVar33._4_4_ = iVar78;
          auVar33._0_4_ = iVar78;
          auVar33._8_4_ = iVar79;
          auVar33._12_4_ = iVar79;
          auVar68._4_4_ = auVar83._4_4_;
          auVar68._0_4_ = auVar83._4_4_;
          auVar68._8_4_ = auVar83._12_4_;
          auVar68._12_4_ = auVar83._12_4_;
          in_XMM13 = auVar33 & auVar48 | auVar68;
          auVar32 = packssdw(auVar83,in_XMM13);
          auVar32 = packssdw(auVar32 ^ in_XMM14,auVar32 ^ in_XMM14);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 0xe) = 0x30;
          }
          auVar38 = pshufhw(auVar48,auVar48,0x84);
          auVar32 = pshufhw(auVar33,auVar33,0x84);
          auVar39 = pshufhw(auVar38,auVar68,0x84);
          auVar32 = packssdw(auVar32 & auVar38,(auVar39 | auVar32 & auVar38) ^ in_XMM14);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32._14_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar4 + uVar13 + 0xf) = 0x30;
          }
          uVar13 = uVar13 + 0x10;
          lVar6 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 0x10;
          auVar34._8_8_ = lVar6 + 0x10;
          lVar6 = auVar49._8_8_;
          auVar49._0_8_ = auVar49._0_8_ + 0x10;
          auVar49._8_8_ = lVar6 + 0x10;
          lVar6 = auVar94._8_8_;
          auVar94._0_8_ = auVar94._0_8_ + 0x10;
          auVar94._8_8_ = lVar6 + 0x10;
          lVar6 = auVar71._8_8_;
          auVar71._0_8_ = auVar71._0_8_ + 0x10;
          auVar71._8_8_ = lVar6 + 0x10;
          lVar6 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 0x10;
          auVar24._8_8_ = lVar6 + 0x10;
          lVar6 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 0x10;
          auVar26._8_8_ = lVar6 + 0x10;
          lVar6 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 0x10;
          auVar28._8_8_ = lVar6 + 0x10;
          lVar6 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 0x10;
          auVar30._8_8_ = lVar6 + 0x10;
        } while ((lVar9 + 0xfU & 0xfffffffffffffff0) != uVar13);
      }
    }
    else {
      lVar6 = *(long *)((long)pvVar1 + 0x68);
      if (**(int **)(lVar6 + uVar17 * 8) <= lVar12) break;
      printf("                                    ");
    }
    lVar9 = *(long *)((long)pvVar1 + 0x68);
    piVar8 = *(int **)(lVar9 + uVar17 * 8);
    if (lVar12 < *piVar8) {
      lVar6 = *(long *)((long)pvVar1 + 0x70);
      lVar3 = lVar6 - lVar9;
      if (lVar3 != 0) {
        uVar13 = 0;
        do {
          lVar16 = *(long *)(*(long *)(piVar8 + 4) + lVar12 * 8);
          lVar15 = *(long *)(lVar16 + 0x10);
          if (*(long *)(lVar16 + 0x18) != lVar15) {
            uVar14 = 0;
            do {
              if (*(long *)(lVar15 + uVar14 * 8) == *(long *)(lVar9 + uVar13 * 8)) {
                *(undefined1 *)((long)pvVar5 + uVar13) = 0x31;
                piVar8 = *(int **)(lVar9 + uVar17 * 8);
              }
              uVar14 = uVar14 + 1;
              lVar16 = *(long *)(*(long *)(piVar8 + 4) + lVar12 * 8);
              lVar15 = *(long *)(lVar16 + 0x10);
            } while (uVar14 < (ulong)(*(long *)(lVar16 + 0x18) - lVar15 >> 3));
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)(lVar3 >> 3));
        lVar6 = lVar6 - lVar9;
        if (lVar6 != 0) {
          uVar13 = 0;
          do {
            if (*(char *)((long)pvVar5 + uVar13) != '1') {
              *(undefined1 *)((long)pvVar5 + uVar13) = 0x30;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < (ulong)(lVar6 >> 3));
        }
      }
      printf("        %28s");
      auVar2 = _DAT_008403e0;
      lVar9 = *(long *)((long)pvVar1 + 0x70) - *(long *)((long)pvVar1 + 0x68);
      if (lVar9 != 0) {
        lVar9 = lVar9 >> 3;
        lVar9 = lVar9 + (ulong)(lVar9 == 0);
        lVar6 = lVar9 + -1;
        auVar19._8_4_ = (int)lVar6;
        auVar19._0_8_ = lVar6;
        auVar19._12_4_ = (int)((ulong)lVar6 >> 0x20);
        uVar13 = 0;
        auVar20 = _DAT_008403d0;
        auVar21 = _DAT_008403c0;
        auVar22 = _DAT_008466c0;
        auVar23 = _DAT_008466b0;
        auVar25 = _DAT_008466a0;
        auVar27 = _DAT_00846690;
        auVar29 = _DAT_00846680;
        auVar31 = _DAT_00846670;
        do {
          auVar34 = auVar19 ^ auVar2;
          auVar49 = auVar20 ^ auVar2;
          iVar78 = auVar34._0_4_;
          iVar80 = -(uint)(iVar78 < auVar49._0_4_);
          iVar79 = auVar34._4_4_;
          auVar51._4_4_ = -(uint)(iVar79 < auVar49._4_4_);
          iVar36 = auVar34._8_4_;
          iVar88 = -(uint)(iVar36 < auVar49._8_4_);
          iVar37 = auVar34._12_4_;
          auVar51._12_4_ = -(uint)(iVar37 < auVar49._12_4_);
          auVar69._4_4_ = iVar80;
          auVar69._0_4_ = iVar80;
          auVar69._8_4_ = iVar88;
          auVar69._12_4_ = iVar88;
          auVar34 = pshuflw(in_XMM13,auVar69,0xe8);
          auVar50._4_4_ = -(uint)(auVar49._4_4_ == iVar79);
          auVar50._12_4_ = -(uint)(auVar49._12_4_ == iVar37);
          auVar50._0_4_ = auVar50._4_4_;
          auVar50._8_4_ = auVar50._12_4_;
          auVar94 = pshuflw(in_XMM14,auVar50,0xe8);
          auVar51._0_4_ = auVar51._4_4_;
          auVar51._8_4_ = auVar51._12_4_;
          auVar49 = pshuflw(auVar34,auVar51,0xe8);
          auVar95._8_4_ = 0xffffffff;
          auVar95._0_8_ = 0xffffffffffffffff;
          auVar95._12_4_ = 0xffffffff;
          auVar34 = (auVar49 | auVar94 & auVar34) ^ auVar95;
          auVar34 = packssdw(auVar34,auVar34);
          if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar5 + uVar13) = 0x30;
          }
          auVar51 = auVar50 & auVar69 | auVar51;
          auVar34 = packssdw(auVar51,auVar51);
          auVar34 = packssdw(auVar34 ^ auVar95,auVar34 ^ auVar95);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34._0_4_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 1) = 0x30;
          }
          auVar34 = auVar21 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar34._0_4_);
          auVar84._4_4_ = -(uint)(iVar79 < auVar34._4_4_);
          iVar88 = -(uint)(iVar36 < auVar34._8_4_);
          auVar84._12_4_ = -(uint)(iVar37 < auVar34._12_4_);
          auVar52._4_4_ = iVar80;
          auVar52._0_4_ = iVar80;
          auVar52._8_4_ = iVar88;
          auVar52._12_4_ = iVar88;
          auVar70._4_4_ = -(uint)(auVar34._4_4_ == iVar79);
          auVar70._12_4_ = -(uint)(auVar34._12_4_ == iVar37);
          auVar70._0_4_ = auVar70._4_4_;
          auVar70._8_4_ = auVar70._12_4_;
          auVar84._0_4_ = auVar84._4_4_;
          auVar84._8_4_ = auVar84._12_4_;
          auVar34 = auVar70 & auVar52 | auVar84;
          auVar34 = packssdw(auVar34,auVar34);
          auVar34 = packssdw(auVar34 ^ auVar95,auVar34 ^ auVar95);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 2) = 0x30;
          }
          auVar49 = pshufhw(auVar52,auVar52,0x84);
          auVar71 = pshufhw(auVar70,auVar70,0x84);
          auVar94 = pshufhw(auVar49,auVar84,0x84);
          auVar49 = (auVar94 | auVar71 & auVar49) ^ auVar95;
          auVar49 = packssdw(auVar49,auVar49);
          auVar49 = packsswb(auVar49,auVar49);
          if ((auVar49._0_4_ >> 0x18 & 1) != 0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 3) = 0x30;
          }
          auVar49 = auVar22 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar49._0_4_);
          auVar54._4_4_ = -(uint)(iVar79 < auVar49._4_4_);
          iVar88 = -(uint)(iVar36 < auVar49._8_4_);
          auVar54._12_4_ = -(uint)(iVar37 < auVar49._12_4_);
          auVar72._4_4_ = iVar80;
          auVar72._0_4_ = iVar80;
          auVar72._8_4_ = iVar88;
          auVar72._12_4_ = iVar88;
          auVar34 = pshuflw(auVar34,auVar72,0xe8);
          auVar53._4_4_ = -(uint)(auVar49._4_4_ == iVar79);
          auVar53._12_4_ = -(uint)(auVar49._12_4_ == iVar37);
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar94 = pshuflw(auVar95,auVar53,0xe8);
          auVar54._0_4_ = auVar54._4_4_;
          auVar54._8_4_ = auVar54._12_4_;
          auVar49 = pshuflw(auVar34,auVar54,0xe8);
          auVar96._8_4_ = 0xffffffff;
          auVar96._0_8_ = 0xffffffffffffffff;
          auVar96._12_4_ = 0xffffffff;
          auVar34 = (auVar49 | auVar94 & auVar34) ^ auVar96;
          auVar34 = packssdw(auVar34,auVar34);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 4) = 0x30;
          }
          auVar54 = auVar53 & auVar72 | auVar54;
          auVar34 = packssdw(auVar54,auVar54);
          auVar34 = packssdw(auVar34 ^ auVar96,auVar34 ^ auVar96);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34._4_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 5) = 0x30;
          }
          auVar34 = auVar23 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar34._0_4_);
          auVar85._4_4_ = -(uint)(iVar79 < auVar34._4_4_);
          iVar88 = -(uint)(iVar36 < auVar34._8_4_);
          auVar85._12_4_ = -(uint)(iVar37 < auVar34._12_4_);
          auVar55._4_4_ = iVar80;
          auVar55._0_4_ = iVar80;
          auVar55._8_4_ = iVar88;
          auVar55._12_4_ = iVar88;
          auVar73._4_4_ = -(uint)(auVar34._4_4_ == iVar79);
          auVar73._12_4_ = -(uint)(auVar34._12_4_ == iVar37);
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar85._0_4_ = auVar85._4_4_;
          auVar85._8_4_ = auVar85._12_4_;
          auVar34 = auVar73 & auVar55 | auVar85;
          auVar34 = packssdw(auVar34,auVar34);
          auVar34 = packssdw(auVar34 ^ auVar96,auVar34 ^ auVar96);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 6) = 0x30;
          }
          auVar49 = pshufhw(auVar55,auVar55,0x84);
          auVar71 = pshufhw(auVar73,auVar73,0x84);
          auVar94 = pshufhw(auVar49,auVar85,0x84);
          auVar49 = (auVar94 | auVar71 & auVar49) ^ auVar96;
          auVar49 = packssdw(auVar49,auVar49);
          auVar49 = packsswb(auVar49,auVar49);
          if ((auVar49._6_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 7) = 0x30;
          }
          auVar49 = auVar25 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar49._0_4_);
          auVar57._4_4_ = -(uint)(iVar79 < auVar49._4_4_);
          iVar88 = -(uint)(iVar36 < auVar49._8_4_);
          auVar57._12_4_ = -(uint)(iVar37 < auVar49._12_4_);
          auVar74._4_4_ = iVar80;
          auVar74._0_4_ = iVar80;
          auVar74._8_4_ = iVar88;
          auVar74._12_4_ = iVar88;
          auVar34 = pshuflw(auVar34,auVar74,0xe8);
          auVar56._4_4_ = -(uint)(auVar49._4_4_ == iVar79);
          auVar56._12_4_ = -(uint)(auVar49._12_4_ == iVar37);
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar94 = pshuflw(auVar96,auVar56,0xe8);
          auVar57._0_4_ = auVar57._4_4_;
          auVar57._8_4_ = auVar57._12_4_;
          auVar49 = pshuflw(auVar34,auVar57,0xe8);
          auVar97._8_4_ = 0xffffffff;
          auVar97._0_8_ = 0xffffffffffffffff;
          auVar97._12_4_ = 0xffffffff;
          auVar34 = (auVar49 | auVar94 & auVar34) ^ auVar97;
          auVar34 = packssdw(auVar34,auVar34);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 8) = 0x30;
          }
          auVar57 = auVar56 & auVar74 | auVar57;
          auVar34 = packssdw(auVar57,auVar57);
          auVar34 = packssdw(auVar34 ^ auVar97,auVar34 ^ auVar97);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34._8_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 9) = 0x30;
          }
          auVar34 = auVar27 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar34._0_4_);
          auVar86._4_4_ = -(uint)(iVar79 < auVar34._4_4_);
          iVar88 = -(uint)(iVar36 < auVar34._8_4_);
          auVar86._12_4_ = -(uint)(iVar37 < auVar34._12_4_);
          auVar58._4_4_ = iVar80;
          auVar58._0_4_ = iVar80;
          auVar58._8_4_ = iVar88;
          auVar58._12_4_ = iVar88;
          auVar75._4_4_ = -(uint)(auVar34._4_4_ == iVar79);
          auVar75._12_4_ = -(uint)(auVar34._12_4_ == iVar37);
          auVar75._0_4_ = auVar75._4_4_;
          auVar75._8_4_ = auVar75._12_4_;
          auVar86._0_4_ = auVar86._4_4_;
          auVar86._8_4_ = auVar86._12_4_;
          auVar34 = auVar75 & auVar58 | auVar86;
          auVar34 = packssdw(auVar34,auVar34);
          auVar34 = packssdw(auVar34 ^ auVar97,auVar34 ^ auVar97);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 10) = 0x30;
          }
          auVar49 = pshufhw(auVar58,auVar58,0x84);
          auVar71 = pshufhw(auVar75,auVar75,0x84);
          auVar94 = pshufhw(auVar49,auVar86,0x84);
          auVar49 = (auVar94 | auVar71 & auVar49) ^ auVar97;
          auVar49 = packssdw(auVar49,auVar49);
          auVar49 = packsswb(auVar49,auVar49);
          if ((auVar49._10_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 0xb) = 0x30;
          }
          auVar49 = auVar29 ^ auVar2;
          iVar80 = -(uint)(iVar78 < auVar49._0_4_);
          auVar60._4_4_ = -(uint)(iVar79 < auVar49._4_4_);
          iVar88 = -(uint)(iVar36 < auVar49._8_4_);
          auVar60._12_4_ = -(uint)(iVar37 < auVar49._12_4_);
          auVar76._4_4_ = iVar80;
          auVar76._0_4_ = iVar80;
          auVar76._8_4_ = iVar88;
          auVar76._12_4_ = iVar88;
          auVar34 = pshuflw(auVar34,auVar76,0xe8);
          auVar59._4_4_ = -(uint)(auVar49._4_4_ == iVar79);
          auVar59._12_4_ = -(uint)(auVar49._12_4_ == iVar37);
          auVar59._0_4_ = auVar59._4_4_;
          auVar59._8_4_ = auVar59._12_4_;
          auVar94 = pshuflw(auVar97,auVar59,0xe8);
          auVar60._0_4_ = auVar60._4_4_;
          auVar60._8_4_ = auVar60._12_4_;
          auVar49 = pshuflw(auVar34,auVar60,0xe8);
          in_XMM14._8_4_ = 0xffffffff;
          in_XMM14._0_8_ = 0xffffffffffffffff;
          in_XMM14._12_4_ = 0xffffffff;
          auVar34 = (auVar49 | auVar94 & auVar34) ^ in_XMM14;
          auVar34 = packssdw(auVar34,auVar34);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 0xc) = 0x30;
          }
          auVar60 = auVar59 & auVar76 | auVar60;
          auVar34 = packssdw(auVar60,auVar60);
          auVar34 = packssdw(auVar34 ^ in_XMM14,auVar34 ^ in_XMM14);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34._12_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 0xd) = 0x30;
          }
          auVar34 = auVar31 ^ auVar2;
          auVar87._0_4_ = -(uint)(iVar78 < auVar34._0_4_);
          auVar87._4_4_ = -(uint)(iVar79 < auVar34._4_4_);
          auVar87._8_4_ = -(uint)(iVar36 < auVar34._8_4_);
          auVar87._12_4_ = -(uint)(iVar37 < auVar34._12_4_);
          auVar61._4_4_ = auVar87._0_4_;
          auVar61._0_4_ = auVar87._0_4_;
          auVar61._8_4_ = auVar87._8_4_;
          auVar61._12_4_ = auVar87._8_4_;
          iVar78 = -(uint)(auVar34._4_4_ == iVar79);
          iVar79 = -(uint)(auVar34._12_4_ == iVar37);
          auVar35._4_4_ = iVar78;
          auVar35._0_4_ = iVar78;
          auVar35._8_4_ = iVar79;
          auVar35._12_4_ = iVar79;
          auVar77._4_4_ = auVar87._4_4_;
          auVar77._0_4_ = auVar87._4_4_;
          auVar77._8_4_ = auVar87._12_4_;
          auVar77._12_4_ = auVar87._12_4_;
          in_XMM13 = auVar35 & auVar61 | auVar77;
          auVar34 = packssdw(auVar87,in_XMM13);
          auVar34 = packssdw(auVar34 ^ in_XMM14,auVar34 ^ in_XMM14);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 0xe) = 0x30;
          }
          auVar49 = pshufhw(auVar61,auVar61,0x84);
          auVar34 = pshufhw(auVar35,auVar35,0x84);
          auVar94 = pshufhw(auVar49,auVar77,0x84);
          auVar34 = packssdw(auVar34 & auVar49,(auVar94 | auVar34 & auVar49) ^ in_XMM14);
          auVar34 = packsswb(auVar34,auVar34);
          if ((auVar34._14_2_ >> 8 & 1) != 0) {
            *(undefined1 *)((long)pvVar5 + uVar13 + 0xf) = 0x30;
          }
          uVar13 = uVar13 + 0x10;
          lVar6 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 0x10;
          auVar20._8_8_ = lVar6 + 0x10;
          lVar6 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 0x10;
          auVar21._8_8_ = lVar6 + 0x10;
          lVar6 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 0x10;
          auVar22._8_8_ = lVar6 + 0x10;
          lVar6 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 0x10;
          auVar23._8_8_ = lVar6 + 0x10;
          lVar6 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 0x10;
          auVar25._8_8_ = lVar6 + 0x10;
          lVar6 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 0x10;
          auVar27._8_8_ = lVar6 + 0x10;
          lVar6 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 0x10;
          auVar29._8_8_ = lVar6 + 0x10;
          lVar6 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 0x10;
          auVar31._8_8_ = lVar6 + 0x10;
        } while ((lVar9 + 0xfU & 0xfffffffffffffff0) != uVar13);
      }
    }
    putchar(10);
    lVar12 = lVar12 + 1;
  } while( true );
  uVar17 = uVar17 + 1;
  lVar12 = *(long *)((long)pvVar1 + 0x58);
  goto LAB_007bcc9d;
}

Assistant:

void Bmatch_PIInformation ( Abc_Frame_t * pAbc )
{
    int total1 = 0, total2 = 0;
    PI_PO_INFO *        tmpInformation;
    tmpInformation = (PI_PO_INFO *)pAbc->pInformation;
    char       *        ioInformation1, * ioInformation2;
    ioInformation1 = new char[tmpInformation->_f.size() + 1];
    ioInformation2 = new char[tmpInformation->_g.size() + 1];
    ioInformation1[tmpInformation->_f.size()] = '\0';
    ioInformation2[tmpInformation->_g.size()] = '\0';

        for( int i = 0; i < tmpInformation->_f.size() || i < tmpInformation->_g.size(); ++i ) {
            if( i < tmpInformation->_f.size() )
                printf("%6s:                              ", Abc_ObjName((tmpInformation->_f)[i]->thisObj));
            else
                printf("                                     ");
            if( i < tmpInformation->_g.size() )
                printf("%6s:", Abc_ObjName((tmpInformation->_g)[i]->thisObj));
            else
                printf("       ");
            printf("\n");
            for( int j = 0; j < (tmpInformation->_f)[i]->numOfInfluence || j < (tmpInformation->_g)[i]->numOfInfluence; ++j ) {
                if( j < (tmpInformation->_f)[i]->numOfInfluence ) {
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        for( int u = 0; u < (tmpInformation->_f)[i]->funSupp[j]->funSupp.size(); ++u ) {
                            if( (tmpInformation->_f)[i]->funSupp[j]->funSupp[u] == (tmpInformation->_f)[r] ) {
                                ioInformation1[r] = '1';
                            }
                        }
                    }
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        if( ioInformation1[r] != '1' ) {
                            ioInformation1[r] = '0';
                        }
                    }
                    printf("        %28s", ioInformation1 );
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        ioInformation1[r] = '0';
                    }
                }
                else printf("                                    ");
                if( j < (tmpInformation->_g)[i]->numOfInfluence ) {
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        for( int u = 0; u < (tmpInformation->_g)[i]->funSupp[j]->funSupp.size(); ++u ) {
                            if( (tmpInformation->_g)[i]->funSupp[j]->funSupp[u] == (tmpInformation->_g)[r] ) {
                                ioInformation2[r] = '1';
                            }
                        }
                    }
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        if( ioInformation2[r] != '1' ) {
                            ioInformation2[r] = '0';
                        }
                    }
                    printf("        %28s", ioInformation2 );
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        ioInformation2[r] = '0';
                    }
                }
                printf("\n");
            }
        }
    delete [] ioInformation1;
    delete [] ioInformation2;

//
    printf("PI supp information for two circuits : \n");
    printf("  cir1   supp     cir2   supp   \n");
    for( int i = 0; i < tmpInformation->_x.size() || i < tmpInformation->_y.size(); ++i ) {
        if( i < tmpInformation->_x.size() ) {
            total1 += (tmpInformation->_x)[i]->numOfInfluence;
            printf("%6s%7d   ", Abc_ObjName((tmpInformation->_x)[i]->thisObj), \
                                 (tmpInformation->_x)[i]->numOfInfluence );
        }
        else printf("                ");
        if( i < tmpInformation->_y.size() ) {
            total2 += (tmpInformation->_y)[i]->numOfInfluence;
            printf("%6s%7d", Abc_ObjName((tmpInformation->_y)[i]->thisObj), \
                              (tmpInformation->_y)[i]->numOfInfluence );
        }
        else printf("             ");
        printf("\n");
    }
    printf(" total %6d    total %6d   \n", total1, total2 );
}